

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<short> __thiscall wasm::WATParser::Lexer::takeS<short>(Lexer *this)

{
  pointer pAVar1;
  bool bVar2;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    bVar2 = result.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.super_LexResult.span._M_str + 0x8000 < (char *)0x8001;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ != 2) {
      bVar2 = result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str < (char *)0x8000;
    }
    if (bVar2) {
      this->pos = this->pos + (long)local_40;
      pAVar1 = (this->annotations).
               super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
        (this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
      }
      skipSpace(this);
      return (_Optional_base<short,_true,_true>)
             (_Optional_base<short,_true,_true>)
             ((uint)result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                    ._M_payload._M_value.super_LexResult.span._M_str & 0xffff | 0x10000);
    }
  }
  return (_Optional_base<short,_true,_true>)(_Optional_payload<short,_true,_true,_true>)0x0;
}

Assistant:

std::optional<T> Lexer::takeS() {
  static_assert(std::is_integral_v<T> && std::is_signed_v<T>);
  if (auto result = integer(next()); result && result->isSigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  return std::nullopt;
}